

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O3

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
AssignResult2Args<mp::CustomFunctionalConstraint<std::array<int,2ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::DivId>>
          (EExpr *__return_storage_ptr__,
          ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
          *this,CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::DivId>
                *fc)

{
  VarOrConst VVar1;
  
  VVar1 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AssignResult2Args<mp::CustomFunctionalConstraint<std::array<int,2ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::DivId>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
                      *)(this + 0x3f8),fc);
  if (((undefined1  [16])VVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    *(size_ty *)
     ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.
             coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long> + 8) = 6;
    *(inline_storage<double,_6U> **)
     &(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long> =
         &(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
    *(size_ty *)
     ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.
             coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long> + 0x10) = 0;
    *(size_ty *)
     ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.
             vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long> + 8) = 6;
    (__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.
               vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
    *(size_ty *)
     ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.
             vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long> + 0x10) = 0;
    *(size_ty *)
     ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
             folded_.
             super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
             m_data.
             super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long> +
     8) = 8;
    (__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_data_ptr
         = (ptr)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms
                 .folded_.
                 super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                 .m_data.m_storage;
    *(size_ty *)
     ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
             folded_.
             super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
             m_data.
             super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long> +
     0x10) = 0;
    *(size_ty *)
     ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
             coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long> + 8) = 6;
    (__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
               coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
    *(size_ty *)
     ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
             coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long> + 0x10) = 0;
    *(size_ty *)
     ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
             vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long> + 8) = 6;
    (__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
               vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
    *(size_ty *)
     ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
             vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long> + 0x10) = 0;
    *(size_ty *)
     ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
             vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long> + 8) = 6;
    (__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
               vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
    *(size_ty *)
     ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
             vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long> + 0x10) = 0;
    (__return_storage_ptr__->super_QuadraticExpr).constant_term_ = (double)VVar1.field_1;
  }
  else {
    AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression
              (&__return_storage_ptr__->super_QuadraticExpr,(Variable)VVar1.field_1._0_4_);
  }
  return __return_storage_ptr__;
}

Assistant:

EExpr AssignResult2Args(FuncConstraint&& fc) {
    auto vc = GetFlatCvt().AssignResult2Args(
          std::forward<FuncConstraint>(fc));
    return vc.is_var() ? EExpr{ EExpr::Variable{ vc.get_var() } } :
                         EExpr{ EExpr::Constant{ vc.get_const() } };
  }